

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::Resize
          (Array<Qentem::Value<char16_t>_> *this,SizeT new_size)

{
  uint uVar1;
  Value<char16_t> *pVVar2;
  Value<char16_t> *this_00;
  
  if (new_size != 0) {
    uVar1 = this->index_;
    if (new_size < uVar1) {
      pVVar2 = this->storage_;
      this_00 = pVVar2 + new_size;
      do {
        Value<char16_t>::~Value(this_00);
        this_00 = this_00 + 1;
      } while (this_00 < pVVar2 + uVar1);
      this->index_ = new_size;
    }
    resize(this,new_size);
    return;
  }
  Reset(this);
  return;
}

Assistant:

void Resize(SizeT new_size) {
        if (new_size != 0) {
            if (Size() > new_size) {
                // Shrink
                Memory::Dispose((Storage() + new_size), End());
                setSize(new_size);
            }

            resize(new_size);
            return;
        }

        Reset();
    }